

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.h
# Opt level: O2

string * __thiscall
Potassco::toString<double,unsigned_int,unsigned_int>
          (string *__return_storage_ptr__,Potassco *this,double *x,uint *y,uint *z)

{
  string *psVar1;
  string res;
  
  res._M_dataplus._M_p = (pointer)&res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = '\0';
  psVar1 = xconvert(&res,*(double *)this);
  std::__cxx11::string::append((ulong)psVar1,'\x01');
  psVar1 = xconvert(&res,*(uint *)x);
  std::__cxx11::string::append((ulong)psVar1,'\x01');
  psVar1 = xconvert(&res,*y);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::~string((string *)&res);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const T& x, const U& y, const V& z) {
	std::string res;
	xconvert(res, x).append(1, ',');
	xconvert(res, y).append(1, ',');
	return xconvert(res, z);
}